

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::OnActionCommand(CommandRunner *this,ActionCommand *command)

{
  uint32_t line_number;
  bool bVar1;
  Trap *this_00;
  undefined8 uVar2;
  string local_88;
  undefined1 local_68 [8];
  ActionResult result;
  ActionCommand *command_local;
  CommandRunner *this_local;
  
  result.trap.root_index_ = (Index)command;
  RunAction((ActionResult *)local_68,this,
            (command->super_CommandMixin<(wabt::CommandType)2>).super_Command.line,&command->action,
            Verbose);
  bVar1 = wabt::interp::RefPtr::operator_cast_to_bool
                    ((RefPtr *)
                     &result.values.
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    line_number = *(uint32_t *)(result.trap.root_index_ + 0xc);
    this_00 = wabt::interp::RefPtr<wabt::interp::Trap>::operator->
                        ((RefPtr<wabt::interp::Trap> *)
                         &result.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    wabt::interp::Trap::message_abi_cxx11_(&local_88,this_00);
    uVar2 = std::__cxx11::string::c_str();
    PrintError(this,line_number,"unexpected trap: %s",uVar2);
    std::__cxx11::string::~string((string *)&local_88);
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  ActionResult::~ActionResult((ActionResult *)local_68);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result CommandRunner::OnActionCommand(const ActionCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Verbose);

  if (result.trap) {
    PrintError(command->line, "unexpected trap: %s",
               result.trap->message().c_str());
    return wabt::Result::Error;
  }

  return wabt::Result::Ok;
}